

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

void __thiscall CVmObjString::CVmObjString(CVmObjString *this,char *str,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  uint16_t tmp;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003425a0;
  if (len < 0x10000) {
    iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,len + 2,this);
    (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
    *(short *)CONCAT44(extraout_var,iVar1) = (short)len;
    memcpy((this->super_CVmObject).ext_ + 2,str,len);
    return;
  }
  (this->super_CVmObject).ext_ = (char *)0x0;
  err_throw(0x7ec);
}

Assistant:

CVmObjString::CVmObjString(VMG_ const char *str, size_t len)
{
    /* check for the length limit */
    if (len > 65535)
    {
        ext_ = 0;
        err_throw(VMERR_STR_TOO_LONG);
    }        

    /* 
     *   allocate space for the string plus the length prefix in the
     *   variable heap 
     */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(len + VMB_LEN, this);

    /* 
     *   store the length prefix in portable format (so that we can easily
     *   write our contents to a saved state file) 
     */
    vmb_put_len(ext_, len);

    /* copy the string's bytes */
    memcpy(ext_ + VMB_LEN, str, len);
}